

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::MergingIterator::Next(MergingIterator *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MergingIterator *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  IteratorWrapper *child;
  int i;
  IteratorWrapper *in_stack_ffffffffffffff88;
  Slice *in_stack_ffffffffffffff90;
  IteratorWrapper *this_00;
  int local_44;
  Slice local_38;
  undefined8 local_28 [2];
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (*(in_RDI->super_Iterator)._vptr_Iterator[2])();
  if ((uVar2 & 1) == 0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/merger.cc"
                  ,0x38,"virtual void leveldb::(anonymous namespace)::MergingIterator::Next()");
  }
  if (in_RDI->direction_ != kForward) {
    for (local_44 = 0; local_44 < in_RDI->n_; local_44 = local_44 + 1) {
      this_00 = in_RDI->children_ + local_44;
      if (this_00 != in_RDI->current_) {
        iVar3 = (*(in_RDI->super_Iterator)._vptr_Iterator[8])();
        local_18 = CONCAT44(extraout_var,iVar3);
        IteratorWrapper::Seek(this_00,in_stack_ffffffffffffff90);
        bVar1 = IteratorWrapper::Valid(in_stack_ffffffffffffff88);
        bVar4 = false;
        if (bVar1) {
          in_stack_ffffffffffffff90 = (Slice *)in_RDI->comparator_;
          iVar3 = (*(in_RDI->super_Iterator)._vptr_Iterator[8])();
          local_28[0] = CONCAT44(extraout_var_00,iVar3);
          local_38 = IteratorWrapper::key(this_00);
          iVar3 = (**(code **)(in_stack_ffffffffffffff90->data_ + 0x10))
                            (in_stack_ffffffffffffff90,local_28,&local_38);
          bVar4 = iVar3 == 0;
        }
        if (bVar4) {
          IteratorWrapper::Next(in_stack_ffffffffffffff88);
        }
      }
    }
    in_RDI->direction_ = kForward;
  }
  IteratorWrapper::Next(in_stack_ffffffffffffff88);
  FindSmallest(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Next() override {
    assert(Valid());

    // Ensure that all children are positioned after key().
    // If we are moving in the forward direction, it is already
    // true for all of the non-current_ children since current_ is
    // the smallest child and key() == current_->key().  Otherwise,
    // we explicitly position the non-current_ children.
    if (direction_ != kForward) {
      for (int i = 0; i < n_; i++) {
        IteratorWrapper* child = &children_[i];
        if (child != current_) {
          child->Seek(key());
          if (child->Valid() &&
              comparator_->Compare(key(), child->key()) == 0) {
            child->Next();
          }
        }
      }
      direction_ = kForward;
    }

    current_->Next();
    FindSmallest();
  }